

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

void __thiscall Process::runProcess(Process *this)

{
  double dVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  long lVar5;
  Process *this_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  vector<int,_std::allocator<int>_> distribution;
  uint local_74;
  double local_70;
  vector<int,_std::allocator<int>_> local_68;
  double local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_74 = 0;
  dVar1 = (double)this->t;
  local_70 = this->tau;
  lVar5 = 0;
  do {
    this_00 = this;
    local_50 = dVar1;
    (**this->_vptr_Process)(this,(ulong)local_74);
    iVar2 = yesOrNo(this_00,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    if (iVar2 == 0) {
      local_70 = local_70 + this->tau;
    }
    else {
      local_74 = local_74 + 1;
      local_70 = this->tau;
    }
    if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_68,
                 (iterator)
                 local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_74);
    }
    else {
      *local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_74;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," t = ",5);
    poVar3 = std::ostream::_M_insert<double>(local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    f(t) = ",0xb);
    plVar4 = (long *)std::ostream::operator<<
                               (poVar3,*(int *)((long)local_68.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar5))
    ;
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_8ad0,0x21);
    poVar3 = std::ostream::_M_insert<double>(local_70);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,anon_var_dwarf_8ae9,0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    dVar1 = local_50 + this->tau;
    lVar5 = lVar5 + 4;
  } while (dVar1 < (double)this->T);
  std::vector<int,_std::allocator<int>_>::vector(&local_48,&local_68);
  fileOutPut(this,&local_48);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Process::runProcess() {
        std::vector <int> distribution;
        int k = 0;
        int i = 0;
        double t0 = t;
        double deltaT = tau;
            do{
                if (yesOrNo(probabilityPoisson(k, t0)) != 0){
                        k+=1;
                        deltaT = tau;
                    }
                else{
                    k+=0;
                    deltaT+=tau;
                }
                distribution.push_back(k);
                std::cout << std::endl;
                std::cout << " t = " << t0 << "    f(t) = " << distribution[i] << std::endl;
                std::cout << " Время без успеха: " << deltaT << " секунд" << std::endl;
                std::cout << std::endl;
                i++;
                t0+=tau;
              } while(t0 < T);
            fileOutPut(distribution);
}